

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::UnitTestOptions::FilterMatchesTest
               (string *test_suite_name,string *test_name)

{
  bool bVar1;
  PositiveAndNegativeUnitTestFilter local_b8;
  string *local_18;
  string *test_name_local;
  string *test_suite_name_local;
  
  local_18 = test_name;
  test_name_local = test_suite_name;
  anon_unknown_38::PositiveAndNegativeUnitTestFilter::PositiveAndNegativeUnitTestFilter
            (&local_b8,(string *)FLAGS_gtest_filter_abi_cxx11_);
  bVar1 = anon_unknown_38::PositiveAndNegativeUnitTestFilter::MatchesTest
                    (&local_b8,test_name_local,local_18);
  anon_unknown_38::PositiveAndNegativeUnitTestFilter::~PositiveAndNegativeUnitTestFilter(&local_b8);
  return bVar1;
}

Assistant:

bool UnitTestOptions::FilterMatchesTest(const std::string& test_suite_name,
                                        const std::string& test_name) {
  // Split --gtest_filter at '-', if there is one, to separate into
  // positive filter and negative filter portions
  return PositiveAndNegativeUnitTestFilter(GTEST_FLAG_GET(filter))
      .MatchesTest(test_suite_name, test_name);
}